

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::WriteLocalAllRules
          (cmLocalUnixMakefileGenerator3 *this,ostream *ruleFileStream)

{
  cmOutputConverter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmGeneratorTarget *pcVar3;
  _Base_ptr p_Var4;
  pointer pcVar5;
  cmMakefile *this_01;
  _Alloc_hider _Var6;
  size_type sVar7;
  pointer pbVar8;
  pointer pbVar9;
  bool bVar10;
  int iVar11;
  TargetType TVar12;
  string *psVar13;
  char *pcVar14;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar15;
  size_t sVar16;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar17;
  long *plVar18;
  long *plVar19;
  pointer pbVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  pointer ppcVar22;
  string mf2Dir;
  string runRule;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string recursiveTarget;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string local_208;
  string progressDir;
  string cmakefileName;
  ios_base local_150 [264];
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  
  WriteDisclaimer(this,ruleFileStream);
  recursiveTarget.field_2._M_allocated_capacity = 0;
  recursiveTarget._M_dataplus._M_p = (pointer)0x0;
  recursiveTarget._M_string_length = 0;
  progressDir.field_2._M_allocated_capacity = 0;
  progressDir._M_dataplus._M_p = (pointer)0x0;
  progressDir._M_string_length = 0;
  paVar21 = &cmakefileName.field_2;
  cmakefileName._M_dataplus._M_p = (pointer)paVar21;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,"all","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&recursiveTarget,
             &cmakefileName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar21) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  cmakefileName._M_dataplus._M_p = (pointer)paVar21;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,"default_target","");
  WriteMakeRule(this,ruleFileStream,"Default target executed when no arguments are given to make.",
                &cmakefileName,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&recursiveTarget,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&progressDir,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar21) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  iVar11 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
             _vptr_cmGlobalGenerator[0x27])();
  if ((char)iVar11 != '\0') {
    mf2Dir._M_dataplus._M_p = (pointer)0x0;
    mf2Dir._M_string_length = 0;
    mf2Dir.field_2._M_allocated_capacity = 0;
    cmakefileName._M_dataplus._M_p = (pointer)paVar21;
    std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,".NOTPARALLEL","");
    WriteMakeRule(this,ruleFileStream,
                  "Allow only one \"make -f Makefile2\" at a time, but pass parallelism.",
                  &cmakefileName,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&mf2Dir,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&progressDir,false,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmakefileName._M_dataplus._M_p != paVar21) {
      operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1
                     );
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&mf2Dir);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&progressDir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&recursiveTarget);
  WriteSpecialTargetsTop(this,ruleFileStream);
  std::__ostream_insert<char,std::char_traits<char>>
            (ruleFileStream,"#======================================",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            (ruleFileStream,"=======================================\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            (ruleFileStream,"# Targets provided globally by CMake.\n",0x26);
  std::__ostream_insert<char,std::char_traits<char>>(ruleFileStream,"\n",1);
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            (&targets,&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets)
  ;
  if (targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar22 = targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      TVar12 = cmGeneratorTarget::GetType(*ppcVar22);
      if (TVar12 == GLOBAL_TARGET) {
        psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar22);
        std::operator+(&cmakefileName,"Special rule for the target ",psVar13);
        mf2Dir._M_dataplus._M_p = (pointer)0x0;
        mf2Dir._M_string_length = 0;
        mf2Dir.field_2._M_allocated_capacity = 0;
        runRule.field_2._M_allocated_capacity = 0;
        runRule._M_dataplus._M_p = (pointer)0x0;
        runRule._M_string_length = 0;
        pcVar3 = *ppcVar22;
        recursiveTarget._M_dataplus._M_p = (pointer)&recursiveTarget.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&recursiveTarget,"EchoString","");
        pcVar14 = cmGeneratorTarget::GetProperty(pcVar3,&recursiveTarget);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)recursiveTarget._M_dataplus._M_p != &recursiveTarget.field_2) {
          operator_delete(recursiveTarget._M_dataplus._M_p,
                          recursiveTarget.field_2._M_allocated_capacity + 1);
        }
        sVar7 = runRule._M_string_length;
        if (pcVar14 == (char *)0x0) {
          pcVar14 = "Running external command ...";
        }
        psVar15 = cmGeneratorTarget::GetUtilities_abi_cxx11_(*ppcVar22);
        p_Var4 = (psVar15->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        psVar15 = cmGeneratorTarget::GetUtilities_abi_cxx11_(*ppcVar22);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&runRule,
                   sVar7,p_Var4,&(psVar15->_M_t)._M_impl.super__Rb_tree_header);
        paVar21 = &recursiveTarget.field_2;
        recursiveTarget._M_dataplus._M_p = (pointer)paVar21;
        sVar16 = strlen(pcVar14);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&recursiveTarget,pcVar14,pcVar14 + sVar16);
        AppendEcho(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&mf2Dir,&recursiveTarget,EchoGlobal,(EchoProgress *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)recursiveTarget._M_dataplus._M_p != paVar21) {
          operator_delete(recursiveTarget._M_dataplus._M_p,
                          recursiveTarget.field_2._M_allocated_capacity + 1);
        }
        pcVar3 = *ppcVar22;
        pvVar17 = cmGeneratorTarget::GetPreBuildCommands(pcVar3);
        AppendCustomDepends(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&runRule,pvVar17);
        pvVar17 = cmGeneratorTarget::GetPostBuildCommands(pcVar3);
        AppendCustomDepends(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&runRule,pvVar17);
        pvVar17 = cmGeneratorTarget::GetPreBuildCommands(pcVar3);
        AppendCustomCommands
                  (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&mf2Dir,pvVar17,pcVar3,START_OUTPUT);
        pvVar17 = cmGeneratorTarget::GetPostBuildCommands(pcVar3);
        AppendCustomCommands
                  (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&mf2Dir,pvVar17,pcVar3,START_OUTPUT);
        psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar3);
        pcVar5 = (psVar13->_M_dataplus)._M_p;
        recursiveTarget._M_dataplus._M_p = (pointer)paVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&recursiveTarget,pcVar5,pcVar5 + psVar13->_M_string_length);
        WriteMakeRule(this,ruleFileStream,cmakefileName._M_dataplus._M_p,&recursiveTarget,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&runRule,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&mf2Dir,true,false);
        sVar7 = runRule._M_string_length;
        _Var6 = runRule._M_dataplus;
        if ((pointer)runRule._M_string_length != runRule._M_dataplus._M_p) {
          plVar19 = (long *)(runRule._M_dataplus._M_p + 0x10);
          do {
            if (plVar19 != (long *)plVar19[-2]) {
              operator_delete((long *)plVar19[-2],*plVar19 + 1);
            }
            plVar18 = plVar19 + 2;
            plVar19 = plVar19 + 4;
          } while (plVar18 != (long *)sVar7);
          runRule._M_string_length = (size_type)_Var6._M_p;
        }
        iVar11 = std::__cxx11::string::compare((char *)&recursiveTarget);
        if (iVar11 == 0) {
LAB_00385fd9:
          progressDir._M_dataplus._M_p = (pointer)&progressDir.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&progressDir,"preinstall/fast","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&runRule,
                     &progressDir);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)progressDir._M_dataplus._M_p != &progressDir.field_2) {
            operator_delete(progressDir._M_dataplus._M_p,
                            progressDir.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          iVar11 = std::__cxx11::string::compare((char *)&recursiveTarget);
          if (iVar11 == 0) goto LAB_00385fd9;
          iVar11 = std::__cxx11::string::compare((char *)&recursiveTarget);
          if (iVar11 == 0) goto LAB_00385fd9;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&runRule,&recursiveTarget);
          sVar7 = mf2Dir._M_string_length;
          _Var6 = mf2Dir._M_dataplus;
          if ((pointer)mf2Dir._M_string_length != mf2Dir._M_dataplus._M_p) {
            plVar19 = (long *)(mf2Dir._M_dataplus._M_p + 0x10);
            do {
              if (plVar19 != (long *)plVar19[-2]) {
                operator_delete((long *)plVar19[-2],*plVar19 + 1);
              }
              plVar18 = plVar19 + 2;
              plVar19 = plVar19 + 4;
            } while (plVar18 != (long *)sVar7);
            mf2Dir._M_string_length = (size_type)_Var6._M_p;
          }
        }
        std::__cxx11::string::append((char *)&recursiveTarget);
        WriteMakeRule(this,ruleFileStream,cmakefileName._M_dataplus._M_p,&recursiveTarget,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&runRule,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&mf2Dir,true,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)recursiveTarget._M_dataplus._M_p != &recursiveTarget.field_2) {
          operator_delete(recursiveTarget._M_dataplus._M_p,
                          recursiveTarget.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&runRule);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&mf2Dir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cmakefileName._M_dataplus._M_p != &cmakefileName.field_2) {
          operator_delete(cmakefileName._M_dataplus._M_p,
                          cmakefileName.field_2._M_allocated_capacity + 1);
        }
      }
      ppcVar22 = ppcVar22 + 1;
    } while (ppcVar22 !=
             targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  paVar21 = &cmakefileName.field_2;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar14 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&recursiveTarget,pcVar14,(allocator *)&cmakefileName);
  std::__cxx11::string::append((char *)&recursiveTarget);
  cmakefileName._M_dataplus._M_p = (pointer)paVar21;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&cmakefileName,"cmake_check_build_system","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
             &cmakefileName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar21) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  pcVar14 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&progressDir,pcVar14,(allocator *)&cmakefileName);
  std::__cxx11::string::append((char *)&progressDir);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmakefileName);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&cmakefileName,"$(CMAKE_COMMAND) -E cmake_progress_start ",0x29);
  this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  cmOutputConverter::Convert(&mf2Dir,this_00,&progressDir,FULL,SHELL);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&cmakefileName,mf2Dir._M_dataplus._M_p,mf2Dir._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mf2Dir._M_dataplus._M_p != &mf2Dir.field_2) {
    operator_delete(mf2Dir._M_dataplus._M_p,mf2Dir.field_2._M_allocated_capacity + 1);
  }
  mf2Dir._M_dataplus._M_p = (pointer)&mf2Dir.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&mf2Dir,"/CMakeFiles","");
  std::__cxx11::string::append((char *)&mf2Dir);
  ConvertToFullPath(&runRule,this,&mf2Dir);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&cmakefileName," ",1);
  cmOutputConverter::Convert(&local_208,this_00,&runRule,FULL,SHELL);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&cmakefileName,local_208._M_dataplus._M_p,local_208._M_string_length);
  paVar2 = &local_208.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
             &local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &runRule.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)runRule._M_dataplus._M_p != paVar1) {
    operator_delete(runRule._M_dataplus._M_p,runRule.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mf2Dir._M_dataplus._M_p != &mf2Dir.field_2) {
    operator_delete(mf2Dir._M_dataplus._M_p,mf2Dir.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmakefileName);
  std::ios_base::~ios_base(local_150);
  mf2Dir._M_dataplus._M_p = (pointer)&mf2Dir.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&mf2Dir,"CMakeFiles/","");
  std::__cxx11::string::append((char *)&mf2Dir);
  GetRecursiveMakeCall(&cmakefileName,this,mf2Dir._M_dataplus._M_p,&recursiveTarget);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
             &cmakefileName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar21) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  pcVar14 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
  CreateCDCommand(this,&commands,pcVar14,START_OUTPUT);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmakefileName);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&cmakefileName,"$(CMAKE_COMMAND) -E cmake_progress_start ",0x29);
  cmOutputConverter::Convert(&runRule,this_00,&progressDir,FULL,SHELL);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&cmakefileName,runRule._M_dataplus._M_p,runRule._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)runRule._M_dataplus._M_p != paVar1) {
    operator_delete(runRule._M_dataplus._M_p,runRule.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&cmakefileName," 0",2);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,&runRule
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)runRule._M_dataplus._M_p != paVar1) {
    operator_delete(runRule._M_dataplus._M_p,runRule.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmakefileName);
  std::ios_base::~ios_base(local_150);
  cmakefileName._M_dataplus._M_p = (pointer)paVar21;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,"all","");
  WriteMakeRule(this,ruleFileStream,"The main all target",&cmakefileName,&depends,&commands,true,
                false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar21) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  pcVar14 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
  sVar7 = recursiveTarget._M_string_length;
  strlen(pcVar14);
  std::__cxx11::string::_M_replace((ulong)&recursiveTarget,0,(char *)sVar7,(ulong)pcVar14);
  std::__cxx11::string::append((char *)&recursiveTarget);
  pbVar9 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar8 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar21 = &(commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar19 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar21 + -1))->_M_dataplus)._M_p;
      if (paVar21 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar19) {
        operator_delete(plVar19,paVar21->_M_allocated_capacity + 1);
      }
      pbVar20 = (pointer)(paVar21 + 1);
      paVar21 = paVar21 + 2;
    } while (pbVar20 != pbVar9);
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar8;
  }
  pbVar9 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar8 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar21 = &(depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar19 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar21 + -1))->_M_dataplus)._M_p;
      if (paVar21 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar19) {
        operator_delete(plVar19,paVar21->_M_allocated_capacity + 1);
      }
      pbVar20 = (pointer)(paVar21 + 1);
      paVar21 = paVar21 + 2;
    } while (pbVar20 != pbVar9);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar8;
  }
  GetRecursiveMakeCall(&cmakefileName,this,mf2Dir._M_dataplus._M_p,&recursiveTarget);
  paVar21 = &cmakefileName.field_2;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
             &cmakefileName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar21) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  pcVar14 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
  CreateCDCommand(this,&commands,pcVar14,START_OUTPUT);
  cmakefileName._M_dataplus._M_p = (pointer)paVar21;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,"clean","");
  WriteMakeRule(this,ruleFileStream,"The main clean target",&cmakefileName,&depends,&commands,true,
                false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar21) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  pbVar9 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar8 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar21 = &(commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar19 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar21 + -1))->_M_dataplus)._M_p;
      if (paVar21 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar19) {
        operator_delete(plVar19,paVar21->_M_allocated_capacity + 1);
      }
      pbVar20 = (pointer)(paVar21 + 1);
      paVar21 = paVar21 + 2;
    } while (pbVar20 != pbVar9);
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar8;
  }
  pbVar9 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar8 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar21 = &(depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar19 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar21 + -1))->_M_dataplus)._M_p;
      if (paVar21 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar19) {
        operator_delete(plVar19,paVar21->_M_allocated_capacity + 1);
      }
      pbVar20 = (pointer)(paVar21 + 1);
      paVar21 = paVar21 + 2;
    } while (pbVar20 != pbVar9);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar8;
  }
  paVar21 = &cmakefileName.field_2;
  cmakefileName._M_dataplus._M_p = (pointer)paVar21;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,"clean","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
             &cmakefileName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar21) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  cmakefileName._M_dataplus._M_p = (pointer)paVar21;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,"clean/fast","");
  WriteMakeRule(this,ruleFileStream,"The main clean target",&cmakefileName,&depends,&commands,true,
                false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar21) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  pcVar14 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
  sVar7 = recursiveTarget._M_string_length;
  strlen(pcVar14);
  std::__cxx11::string::_M_replace((ulong)&recursiveTarget,0,(char *)sVar7,(ulong)pcVar14);
  std::__cxx11::string::append((char *)&recursiveTarget);
  pbVar9 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar8 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar21 = &(commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar19 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar21 + -1))->_M_dataplus)._M_p;
      if (paVar21 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar19) {
        operator_delete(plVar19,paVar21->_M_allocated_capacity + 1);
      }
      pbVar20 = (pointer)(paVar21 + 1);
      paVar21 = paVar21 + 2;
    } while (pbVar20 != pbVar9);
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar8;
  }
  pbVar9 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar8 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar21 = &(depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar19 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar21 + -1))->_M_dataplus)._M_p;
      if (paVar21 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar19) {
        operator_delete(plVar19,paVar21->_M_allocated_capacity + 1);
      }
      pbVar20 = (pointer)(paVar21 + 1);
      paVar21 = paVar21 + 2;
    } while (pbVar20 != pbVar9);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar8;
  }
  this_01 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  paVar21 = &cmakefileName.field_2;
  cmakefileName._M_dataplus._M_p = (pointer)paVar21;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&cmakefileName,"CMAKE_SKIP_INSTALL_ALL_DEPENDENCY","");
  pcVar14 = cmMakefile::GetDefinition(this_01,&cmakefileName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar21) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  if (pcVar14 != (char *)0x0) {
    bVar10 = cmSystemTools::IsOff(pcVar14);
    if (!bVar10) {
      cmakefileName._M_dataplus._M_p = (pointer)paVar21;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&cmakefileName,"cmake_check_build_system","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                 &cmakefileName);
      goto LAB_003869ff;
    }
  }
  cmakefileName._M_dataplus._M_p = (pointer)paVar21;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,"all","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
             &cmakefileName);
LAB_003869ff:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar21) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  GetRecursiveMakeCall(&cmakefileName,this,mf2Dir._M_dataplus._M_p,&recursiveTarget);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
             &cmakefileName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar21) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  pcVar14 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
  CreateCDCommand(this,&commands,pcVar14,START_OUTPUT);
  cmakefileName._M_dataplus._M_p = (pointer)paVar21;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,"preinstall","");
  WriteMakeRule(this,ruleFileStream,"Prepare targets for installation.",&cmakefileName,&depends,
                &commands,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar21) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  pbVar9 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar8 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar21 = &(depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar19 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar21 + -1))->_M_dataplus)._M_p;
      if (paVar21 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar19) {
        operator_delete(plVar19,paVar21->_M_allocated_capacity + 1);
      }
      pbVar20 = (pointer)(paVar21 + 1);
      paVar21 = paVar21 + 2;
    } while (pbVar20 != pbVar9);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar8;
  }
  cmakefileName._M_dataplus._M_p = (pointer)&cmakefileName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,"preinstall/fast","");
  WriteMakeRule(this,ruleFileStream,"Prepare targets for installation.",&cmakefileName,&depends,
                &commands,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != &cmakefileName.field_2) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  pbVar9 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar8 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar21 = &(depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar19 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar21 + -1))->_M_dataplus)._M_p;
      if (paVar21 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar19) {
        operator_delete(plVar19,paVar21->_M_allocated_capacity + 1);
      }
      pbVar20 = (pointer)(paVar21 + 1);
      paVar21 = paVar21 + 2;
    } while (pbVar20 != pbVar9);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar8;
  }
  pbVar9 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar8 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar21 = &(commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar19 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar21 + -1))->_M_dataplus)._M_p;
      if (paVar21 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar19) {
        operator_delete(plVar19,paVar21->_M_allocated_capacity + 1);
      }
      pbVar20 = (pointer)(paVar21 + 1);
      paVar21 = paVar21 + 2;
    } while (pbVar20 != pbVar9);
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar8;
  }
  cmakefileName._M_dataplus._M_p = (pointer)&cmakefileName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,"CMakeFiles/","");
  std::__cxx11::string::append((char *)&cmakefileName);
  runRule._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&runRule,"$(CMAKE_COMMAND) -H$(CMAKE_SOURCE_DIR) -B$(CMAKE_BINARY_DIR)","");
  std::__cxx11::string::append((char *)&runRule);
  cmOutputConverter::Convert(&local_208,this_00,&cmakefileName,NONE,SHELL);
  std::__cxx11::string::_M_append((char *)&runRule,(ulong)local_208._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&runRule);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&commands,&runRule);
  pcVar14 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
  CreateCDCommand(this,&commands,pcVar14,START_OUTPUT);
  local_208._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"depend","");
  WriteMakeRule(this,ruleFileStream,"clear depends",&local_208,&depends,&commands,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)runRule._M_dataplus._M_p != paVar1) {
    operator_delete(runRule._M_dataplus._M_p,runRule.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != &cmakefileName.field_2) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mf2Dir._M_dataplus._M_p != &mf2Dir.field_2) {
    operator_delete(mf2Dir._M_dataplus._M_p,mf2Dir.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)progressDir._M_dataplus._M_p != &progressDir.field_2) {
    operator_delete(progressDir._M_dataplus._M_p,progressDir.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)recursiveTarget._M_dataplus._M_p != &recursiveTarget.field_2) {
    operator_delete(recursiveTarget._M_dataplus._M_p,
                    recursiveTarget.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  if (targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(targets.
                    super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)targets.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)targets.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3
::WriteLocalAllRules(std::ostream& ruleFileStream)
{
  this->WriteDisclaimer(ruleFileStream);

  // Write the main entry point target.  This must be the VERY first
  // target so that make with no arguments will run it.
  {
  // Just depend on the all target to drive the build.
  std::vector<std::string> depends;
  std::vector<std::string> no_commands;
  depends.push_back("all");

  // Write the rule.
  this->WriteMakeRule(ruleFileStream,
                      "Default target executed when no arguments are "
                      "given to make.",
                      "default_target",
                      depends,
                      no_commands, true);

  // Help out users that try "gmake target1 target2 -j".
  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  if(gg->AllowNotParallel())
    {
    std::vector<std::string> no_depends;
    this->WriteMakeRule(ruleFileStream,
      "Allow only one \"make -f Makefile2\" at a time, but pass parallelism.",
      ".NOTPARALLEL", no_depends, no_commands, false);
    }
  }

  this->WriteSpecialTargetsTop(ruleFileStream);

  // Include the progress variables for the target.
  // Write all global targets
  this->WriteDivider(ruleFileStream);
  ruleFileStream
    << "# Targets provided globally by CMake.\n"
    << "\n";
  std::vector<cmGeneratorTarget*> targets = this->GetGeneratorTargets();
  std::vector<cmGeneratorTarget*>::iterator glIt;
  for ( glIt = targets.begin(); glIt != targets.end(); ++ glIt )
    {
    if ( (*glIt)->GetType() == cmState::GLOBAL_TARGET )
      {
      std::string targetString = "Special rule for the target " +
          (*glIt)->GetName();
      std::vector<std::string> commands;
      std::vector<std::string> depends;

      const char* text = (*glIt)->GetProperty("EchoString");
      if ( !text )
        {
        text = "Running external command ...";
        }
      depends.insert(depends.end(), (*glIt)->GetUtilities().begin(),
                     (*glIt)->GetUtilities().end());
      this->AppendEcho(commands, text,
                       cmLocalUnixMakefileGenerator3::EchoGlobal);

      cmGeneratorTarget* gt = *glIt;

      // Global targets store their rules in pre- and post-build commands.
      this->AppendCustomDepends(depends,
                                gt->GetPreBuildCommands());
      this->AppendCustomDepends(depends,
                                gt->GetPostBuildCommands());
      this->AppendCustomCommands(commands,
                                 gt->GetPreBuildCommands(),
                                 gt,
                                 cmLocalGenerator::START_OUTPUT);
      this->AppendCustomCommands(commands,
                                 gt->GetPostBuildCommands(),
                                 gt,
                                 cmLocalGenerator::START_OUTPUT);
      std::string targetName = gt->GetName();
      this->WriteMakeRule(ruleFileStream, targetString.c_str(),
                          targetName, depends, commands, true);

      // Provide a "/fast" version of the target.
      depends.clear();
      if((targetName == "install")
          || (targetName == "install_local")
          || (targetName == "install_strip"))
        {
        // Provide a fast install target that does not depend on all
        // but has the same command.
        depends.push_back("preinstall/fast");
        }
      else
        {
        // Just forward to the real target so at least it will work.
        depends.push_back(targetName);
        commands.clear();
        }
      targetName += "/fast";
      this->WriteMakeRule(ruleFileStream, targetString.c_str(),
                          targetName, depends, commands, true);
      }
    }

  std::vector<std::string> depends;
  std::vector<std::string> commands;

  // Write the all rule.
  std::string recursiveTarget = this->GetCurrentBinaryDirectory();
  recursiveTarget += "/all";

  depends.push_back("cmake_check_build_system");

  std::string progressDir = this->GetBinaryDirectory();
  progressDir += cmake::GetCMakeFilesDirectory();
    {
    std::ostringstream progCmd;
    progCmd <<
      "$(CMAKE_COMMAND) -E cmake_progress_start ";
    progCmd << this->Convert(progressDir,
                             cmLocalGenerator::FULL,
                             cmLocalGenerator::SHELL);

    std::string progressFile = cmake::GetCMakeFilesDirectory();
    progressFile += "/progress.marks";
    std::string progressFileNameFull =
      this->ConvertToFullPath(progressFile);
    progCmd << " " << this->Convert(progressFileNameFull,
                                    cmLocalGenerator::FULL,
                                    cmLocalGenerator::SHELL);
    commands.push_back(progCmd.str());
    }
  std::string mf2Dir = cmake::GetCMakeFilesDirectoryPostSlash();
  mf2Dir += "Makefile2";
  commands.push_back(this->GetRecursiveMakeCall(mf2Dir.c_str(),
                                                recursiveTarget));
  this->CreateCDCommand(commands,
                        this->GetBinaryDirectory(),
                        cmLocalGenerator::START_OUTPUT);
    {
    std::ostringstream progCmd;
    progCmd << "$(CMAKE_COMMAND) -E cmake_progress_start "; // # 0
    progCmd << this->Convert(progressDir,
                             cmLocalGenerator::FULL,
                             cmLocalGenerator::SHELL);
    progCmd << " 0";
    commands.push_back(progCmd.str());
    }
  this->WriteMakeRule(ruleFileStream, "The main all target", "all",
                      depends, commands, true);

  // Write the clean rule.
  recursiveTarget = this->GetCurrentBinaryDirectory();
  recursiveTarget += "/clean";
  commands.clear();
  depends.clear();
  commands.push_back(this->GetRecursiveMakeCall(mf2Dir.c_str(),
                                                recursiveTarget));
  this->CreateCDCommand(commands,
                                this->GetBinaryDirectory(),
                                cmLocalGenerator::START_OUTPUT);
  this->WriteMakeRule(ruleFileStream, "The main clean target", "clean",
                      depends, commands, true);
  commands.clear();
  depends.clear();
  depends.push_back("clean");
  this->WriteMakeRule(ruleFileStream, "The main clean target", "clean/fast",
                      depends, commands, true);

  // Write the preinstall rule.
  recursiveTarget = this->GetCurrentBinaryDirectory();
  recursiveTarget += "/preinstall";
  commands.clear();
  depends.clear();
  const char* noall =
    this->Makefile->GetDefinition("CMAKE_SKIP_INSTALL_ALL_DEPENDENCY");
  if(!noall || cmSystemTools::IsOff(noall))
    {
    // Drive the build before installing.
    depends.push_back("all");
    }
  else
    {
    // At least make sure the build system is up to date.
    depends.push_back("cmake_check_build_system");
    }
  commands.push_back
    (this->GetRecursiveMakeCall(mf2Dir.c_str(), recursiveTarget));
  this->CreateCDCommand(commands,
                        this->GetBinaryDirectory(),
                        cmLocalGenerator::START_OUTPUT);
  this->WriteMakeRule(ruleFileStream, "Prepare targets for installation.",
                      "preinstall", depends, commands, true);
  depends.clear();
  this->WriteMakeRule(ruleFileStream, "Prepare targets for installation.",
                      "preinstall/fast", depends, commands, true);

  // write the depend rule, really a recompute depends rule
  depends.clear();
  commands.clear();
  std::string cmakefileName = cmake::GetCMakeFilesDirectoryPostSlash();
  cmakefileName += "Makefile.cmake";
  std::string runRule =
    "$(CMAKE_COMMAND) -H$(CMAKE_SOURCE_DIR) -B$(CMAKE_BINARY_DIR)";
  runRule += " --check-build-system ";
  runRule += this->Convert(cmakefileName,cmLocalGenerator::NONE,
                           cmLocalGenerator::SHELL);
  runRule += " 1";
  commands.push_back(runRule);
  this->CreateCDCommand(commands,
                        this->GetBinaryDirectory(),
                        cmLocalGenerator::START_OUTPUT);
  this->WriteMakeRule(ruleFileStream, "clear depends",
                      "depend",
                      depends, commands, true);
}